

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msbuild_objectmodel.cpp
# Opt level: O0

ssize_t __thiscall VCXProjectWriter::write(VCXProjectWriter *this,int __fd,void *__buf,size_t __n)

{
  XmlOutput *this_00;
  XmlOutput *name;
  undefined4 in_register_00000034;
  xml_output *this_01;
  long in_FS_OFFSET;
  QList<QString> *in_stack_fffffffffffffda8;
  QString *in_stack_fffffffffffffdc8;
  QStringList *in_stack_fffffffffffffde0;
  char *in_stack_fffffffffffffde8;
  xml_output *in_stack_fffffffffffffdf8;
  xml_output *o;
  XmlOutput *in_stack_fffffffffffffe00;
  XmlOutput *this_02;
  xml_output local_148 [2];
  XmlOutput local_c8 [2];
  long local_8;
  
  this_01 = (xml_output *)CONCAT44(in_register_00000034,__fd);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  tag(in_stack_fffffffffffffdc8);
  this_00 = XmlOutput::operator<<(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  QString::QString((QString *)this_00,in_stack_fffffffffffffde8);
  tag(in_stack_fffffffffffffdc8);
  XmlOutput::operator<<(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  QList<QString>::QList((QList<QString> *)this_01,in_stack_fffffffffffffda8);
  commandLinesForOutput(in_stack_fffffffffffffde0);
  this_02 = local_c8;
  valueTag(in_stack_fffffffffffffdc8);
  name = XmlOutput::operator<<(this_02,in_stack_fffffffffffffdf8);
  o = local_148;
  QString::QString((QString *)this_00,in_stack_fffffffffffffde8);
  tag((QString *)name);
  XmlOutput::operator<<(this_02,o);
  valueTag((QString *)name);
  XmlOutput::operator<<(this_02,o);
  closetag((QString *)name);
  XmlOutput::operator<<(this_02,o);
  XmlOutput::xml_output::~xml_output(this_01);
  XmlOutput::xml_output::~xml_output(this_01);
  XmlOutput::xml_output::~xml_output(this_01);
  QString::~QString((QString *)0x249488);
  XmlOutput::xml_output::~xml_output(this_01);
  QString::~QString((QString *)0x24949c);
  QList<QString>::~QList((QList<QString> *)0x2494a6);
  XmlOutput::xml_output::~xml_output(this_01);
  QString::~QString((QString *)0x2494ba);
  XmlOutput::xml_output::~xml_output(this_01);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return *(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void VCXProjectWriter::write(XmlOutput &xml, const VCEventTool &tool)
{
    xml
        << tag(tool.EventName)
            << tag(_Command) << valueTag(commandLinesForOutput(tool.CommandLine))
            << tag(_Message) << valueTag(tool.Description)
        << closetag(tool.EventName);
}